

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld_def.c
# Opt level: O1

int free_field(FIELD *field)

{
  FIELD *pFVar1;
  FIELDTYPE *typ;
  int *piVar2;
  FIELD *pFVar3;
  int iVar4;
  
  if (field == (FIELD *)0x0) {
    iVar4 = -2;
  }
  else {
    iVar4 = -4;
    if (field->form == (formnode *)0x0) {
      pFVar1 = field;
      if (field->link == field) {
        if (field->buf != (char *)0x0) {
          free(field->buf);
        }
      }
      else {
        do {
          pFVar3 = pFVar1;
          pFVar1 = pFVar3->link;
        } while (pFVar1 != field);
        pFVar3->link = field->link;
      }
      typ = field->type;
      if (typ != (FIELDTYPE *)0x0) {
        typ->ref = typ->ref + -1;
      }
      _nc_Free_Argument(typ,(TypeArgument *)field->arg);
      free(field);
      iVar4 = 0;
    }
  }
  piVar2 = __errno_location();
  *piVar2 = iVar4;
  return iVar4;
}

Assistant:

int free_field(FIELD * field)
{
  if (!field) 
    RETURN(E_BAD_ARGUMENT);

  if (field->form)
    RETURN(E_CONNECTED);
  
  if (field == field->link)
    {
      if (field->buf) 
	free(field->buf);
    }
  else 
    {
      FIELD *f;

      for(f=field;f->link != field;f = f->link) 
	{}
      f->link = field->link;
    }
  _nc_Free_Type(field);
  free(field);
  RETURN(E_OK);
}